

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_tree_init_stdfile_noclose(mpack_tree_t *tree,FILE *stdfile,size_t max_bytes)

{
  _Bool _Var1;
  mpack_file_tree_t *file_tree_00;
  mpack_file_tree_t *file_tree;
  size_t max_bytes_local;
  FILE *stdfile_local;
  mpack_tree_t *tree_local;
  
  file_tree_00 = (mpack_file_tree_t *)malloc(0x1010);
  if (file_tree_00 == (mpack_file_tree_t *)0x0) {
    mpack_tree_init_error(tree,mpack_error_memory);
  }
  else {
    _Var1 = mpack_file_tree_read(tree,file_tree_00,stdfile,max_bytes);
    if (_Var1) {
      mpack_tree_init(tree,file_tree_00->data,file_tree_00->size);
      mpack_tree_set_context(tree,file_tree_00);
      mpack_tree_set_teardown(tree,mpack_file_tree_teardown);
    }
    else {
      free(file_tree_00);
    }
  }
  return;
}

Assistant:

static void mpack_tree_init_stdfile_noclose(mpack_tree_t* tree, FILE* stdfile, size_t max_bytes) {

    // allocate file tree
    mpack_file_tree_t* file_tree = (mpack_file_tree_t*) MPACK_MALLOC(sizeof(mpack_file_tree_t));
    if (file_tree == NULL) {
        mpack_tree_init_error(tree, mpack_error_memory);
        return;
    }

    // read all data
    if (!mpack_file_tree_read(tree, file_tree, stdfile, max_bytes)) {
        MPACK_FREE(file_tree);
        return;
    }

    mpack_tree_init(tree, file_tree->data, file_tree->size);
    mpack_tree_set_context(tree, file_tree);
    mpack_tree_set_teardown(tree, mpack_file_tree_teardown);
}